

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

int scope_export_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  value pvVar1;
  value *ppvVar2;
  value pvVar3;
  long *in_RCX;
  char *in_RSI;
  value v;
  value *v_array;
  char *key_str;
  scope_export_cb_iterator export_iterator;
  size_t in_stack_ffffffffffffffa8;
  value *in_stack_ffffffffffffffb0;
  
  pvVar1 = value_create_array(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (pvVar1 != (value)0x0) {
    ppvVar2 = value_to_array((value)0x12960e);
    strlen(in_RSI);
    pvVar3 = value_create_string(in_RSI,in_stack_ffffffffffffffa8);
    *ppvVar2 = pvVar3;
    if (*ppvVar2 == (value)0x0) {
      value_type_destroy(key_str);
    }
    else {
      pvVar3 = value_type_copy(val);
      ppvVar2[1] = pvVar3;
      if (ppvVar2[1] == (value)0x0) {
        value_type_destroy(key_str);
      }
      else {
        *(value *)(in_RCX[1] + *in_RCX * 8) = pvVar1;
        *in_RCX = *in_RCX + 1;
      }
    }
  }
  return 0;
}

Assistant:

int scope_export_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	scope_export_cb_iterator export_iterator = (scope_export_cb_iterator)args;

	const char *key_str = (const char *)key;

	value *v_array, v = value_create_array(NULL, 2);

	(void)s;

	if (v == NULL)
	{
		return 0;
	}

	v_array = value_to_array(v);

	v_array[0] = value_create_string(key_str, strlen(key_str));

	if (v_array[0] == NULL)
	{
		value_type_destroy(v);

		return 0;
	}

	v_array[1] = value_type_copy(val);

	if (v_array[1] == NULL)
	{
		value_type_destroy(v);

		return 0;
	}

	export_iterator->values[export_iterator->iterator] = v;
	++export_iterator->iterator;

	return 0;
}